

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::
error<unsigned_int&,char_const(&)[19],std::__cxx11::string,char_const(&)[27]>
          (ValidationContext *this,IssueError *issue,uint *args,char (*args_1) [19],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          char (*args_3) [27])

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar1;
  format_args args_00;
  string_view fmt;
  allocator<char> local_c1;
  undefined1 local_c0 [40];
  string local_98;
  ulong local_78 [2];
  char (*local_68) [19];
  pointer local_58;
  size_type sStack_50;
  char (*local_48) [27];
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_c0[0] = (issue->super_Issue).type;
  local_c0._2_2_ = (issue->super_Issue).id;
  aVar1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
           )args_3;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)(local_c0 + 8),&(issue->super_Issue).message,&local_c1);
  local_78[0] = (ulong)*args;
  local_58 = (args_2->_M_dataplus)._M_p;
  sStack_50 = args_2->_M_string_length;
  args_00.field_1.values_ = aVar1.values_;
  args_00.desc_ = (unsigned_long_long)local_78;
  fmt.size_ = 0xcdc2;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  local_68 = args_1;
  local_48 = args_3;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_98,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            (&this->callback,(ValidationReport *)local_c0);
  ValidationReport::~ValidationReport((ValidationReport *)local_c0);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }